

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

Token * __thiscall Lexer::match_digit(Token *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  lexer_exception *this_00;
  undefined8 uVar4;
  string res;
  stringstream buffer;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  do {
    local_1f8._M_dataplus._M_p._0_1_ = this->current_;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,1);
    advance(this);
  } while (this->current_ == '.' || (byte)(this->current_ - 0x30U) < 10);
  std::__cxx11::stringbuf::str();
  iVar1 = (int)local_1f8._M_string_length;
  bVar2 = Recognition::is_integer(&local_1f8);
  if (bVar2) {
    uVar4._0_4_ = (this->position_).super_Position.row_;
    uVar4._4_4_ = (this->position_).super_Position.col_;
    __return_storage_ptr__->type_ = kIntegerLiteral;
    (__return_storage_ptr__->content_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->content_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->content_,
               CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p),
               CONCAT44(local_1f8._M_string_length._4_4_,(int)local_1f8._M_string_length) +
               CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p));
  }
  else {
    bVar2 = Recognition::is_real(&local_1f8);
    if (!bVar2) {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
      std::__cxx11::stringbuf::str(local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,anon_var_dwarf_48f2b,0x15);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,
                          (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                           (char)local_1f8._M_dataplus._M_p),
                          CONCAT44(local_1f8._M_string_length._4_4_,(int)local_1f8._M_string_length)
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      lexer_exception::lexer_exception(this_00,&this->position_,&local_1d8);
      __cxa_throw(this_00,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
    }
    uVar4._0_4_ = (this->position_).super_Position.row_;
    uVar4._4_4_ = (this->position_).super_Position.col_;
    __return_storage_ptr__->type_ = kRealLiteral;
    (__return_storage_ptr__->content_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->content_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->content_,
               CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p),
               CONCAT44(local_1f8._M_string_length._4_4_,(int)local_1f8._M_string_length) +
               CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p));
  }
  (__return_storage_ptr__->position_).super_Position.row_ = (int)uVar4;
  (__return_storage_ptr__->position_).super_Position.col_ = (int)((ulong)uVar4 >> 0x20);
  (__return_storage_ptr__->position_).super_Position._vptr_Position =
       (_func_int **)&PTR_clear_001539d0;
  (__return_storage_ptr__->position_).length_ = iVar1;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p) !=
      &local_1f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p));
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_digit() {
    std::stringstream buffer;
    do {
        buffer << current_;
        consume(false);
    } while (Recognition::is_digit(current_) || Recognition::is_dot(current_));

    std::string res = buffer.str();
    int length = (int)res.length();
    if (Recognition::is_integer(res)) {
        return Token(Token::Type::kIntegerLiteral, res, TokenPosition(position_, length));
    } else if (Recognition::is_real(res)) {
        return Token(Token::Type::kRealLiteral, res, TokenPosition(position_, length));
    } else {
        buffer.str("");
        buffer << "不正确的数字: \"" << res << "\"";
        throw lexer_exception(position_, buffer.str());
    }
}